

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoded_uint_vector.h
# Opt level: O0

uint __thiscall
s2coding::EncodedUintVector<unsigned_int>::operator[](EncodedUintVector<unsigned_int> *this,int i)

{
  uint uVar1;
  ostream *poVar2;
  bool bVar3;
  S2LogMessage local_28;
  S2LogMessageVoidify local_15;
  int local_14;
  EncodedUintVector<unsigned_int> *pEStack_10;
  int i_local;
  EncodedUintVector<unsigned_int> *this_local;
  
  bVar3 = false;
  if (-1 < i) {
    bVar3 = (uint)i < this->size_;
  }
  local_14 = i;
  pEStack_10 = this;
  if (bVar3) {
    uVar1 = GetUintWithLength<unsigned_int>
                      (this->data_ + (int)(i * (uint)this->len_),(uint)this->len_);
    return uVar1;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_28,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/encoded_uint_vector.h"
             ,0xf6,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_28);
  poVar2 = std::operator<<(poVar2,"Check failed: i >= 0 && i < size_ ");
  S2LogMessageVoidify::operator&(&local_15,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_28);
}

Assistant:

inline T EncodedUintVector<T>::operator[](int i) const {
  S2_DCHECK(i >= 0 && i < size_);
  return GetUintWithLength<T>(data_ + i * len_, len_);
}